

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_compileoption_used(char *zOptName)

{
  char *zRight;
  bool bVar1;
  bool bVar2;
  uint N;
  int iVar3;
  size_t sVar4;
  long lVar5;
  char *__s;
  uchar uVar6;
  uchar uVar7;
  
  if (zOptName == (char *)0x0) {
    __s = (char *)0x0;
    N = 0;
  }
  else {
    lVar5 = 0;
    do {
      if ((ulong)(byte)zOptName[lVar5] == 0) {
        uVar7 = ""[(byte)"SQLITE_"[lVar5]];
        uVar6 = '\0';
LAB_0013700c:
        lVar5 = 7;
        if (uVar6 != uVar7) {
          lVar5 = 0;
        }
        goto LAB_0013701d;
      }
      uVar6 = ""[(byte)zOptName[lVar5]];
      uVar7 = ""[(byte)"SQLITE_"[lVar5]];
      if (uVar6 != uVar7) goto LAB_0013700c;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 7);
    lVar5 = 7;
LAB_0013701d:
    __s = zOptName + lVar5;
    sVar4 = strlen(__s);
    N = (uint)sVar4 & 0x3fffffff;
  }
  lVar5 = 0;
  bVar2 = true;
  do {
    while( true ) {
      bVar1 = bVar2;
      zRight = sqlite3azCompileOpt[lVar5];
      iVar3 = sqlite3_strnicmp(__s,zRight,N);
      if (iVar3 != 0) break;
      lVar5 = 1;
      bVar2 = false;
      if (!(bool)((""[(byte)zRight[N]] & 0x46) != 0 & bVar1)) {
        return (uint)((""[(byte)zRight[N]] & 0x46) == 0);
      }
    }
    lVar5 = 1;
    bVar2 = false;
  } while (bVar1);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_compileoption_used(const char *zOptName){
  int i, n;
  int nOpt;
  const char **azCompileOpt;
 
#if SQLITE_ENABLE_API_ARMOR
  if( zOptName==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  azCompileOpt = sqlite3CompileOptions(&nOpt);

  if( sqlite3StrNICmp(zOptName, "SQLITE_", 7)==0 ) zOptName += 7;
  n = sqlite3Strlen30(zOptName);

  /* Since nOpt is normally in single digits, a linear search is 
  ** adequate. No need for a binary search. */
  for(i=0; i<nOpt; i++){
    if( sqlite3StrNICmp(zOptName, azCompileOpt[i], n)==0
     && sqlite3IsIdChar((unsigned char)azCompileOpt[i][n])==0
    ){
      return 1;
    }
  }
  return 0;
}